

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::Encoder::Encoder(Encoder *this)

{
  pktalloc::Allocator::Allocator(&this->TheAllocator);
  EncoderStats::EncoderStats(&this->Stats);
  EncoderPacketWindow::EncoderPacketWindow(&this->Window);
  EncoderAcknowledgementState::EncoderAcknowledgementState(&this->Ack);
  (this->RecoveryPacket).Data = (uint8_t *)0x0;
  (this->RecoveryPacket).Bytes = 0;
  this->NextRow = 0;
  this->NextParityColumn = 0;
  this->NextCauchyRow = 0;
  (this->Window).TheAllocator = &this->TheAllocator;
  (this->Window).Stats = &this->Stats;
  (this->Ack).TheAllocator = &this->TheAllocator;
  (this->Ack).TheWindow = &this->Window;
  return;
}

Assistant:

Encoder::Encoder()
{
    Window.TheAllocator = &TheAllocator;
    Window.Stats        = &Stats;
    Ack.TheAllocator    = &TheAllocator;
    Ack.TheWindow       = &Window;
}